

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O1

ConstantExpr * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::ConstantExpr,LLVMBC::Instruction::BinaryOps&,LLVMBC::Type*&,std::vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>>>
          (LLVMContext *this,BinaryOps *u,Type **u_1,
          vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *u_2)

{
  BinaryOps opcode_;
  Type *type;
  ConstantExpr *this_00;
  Vector<Value_*> local_40;
  
  this_00 = (ConstantExpr *)allocate(this,0x58,8);
  if (this_00 != (ConstantExpr *)0x0) {
    opcode_ = *u;
    type = *u_1;
    local_40.super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (u_2->super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_40.super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (u_2->super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_40.super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (u_2->super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (u_2->super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (u_2->super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (u_2->super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ConstantExpr::ConstantExpr(this_00,opcode_,type,&local_40);
    if (local_40.
        super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      ::dxil_spv::free_in_thread
                (local_40.
                 super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
    append_typed_destructor<LLVMBC::ConstantExpr>(this,this_00);
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}